

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<QString,_QMakeLocalFileName> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QMakeLocalFileName>_>::findNode<QString>
          (Data<QHashPrivate::Node<QString,_QMakeLocalFileName>_> *this,QString *key)

{
  long lVar1;
  bool bVar2;
  Node<QString,_QMakeLocalFileName> *pNVar3;
  QString *in_RDI;
  long in_FS_OFFSET;
  Bucket bucket;
  Data<QHashPrivate::Node<QString,_QMakeLocalFileName>_> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findBucket<QString>(in_stack_ffffffffffffffe0,in_RDI);
  bVar2 = Bucket::isUnused((Bucket *)0x1c99fb);
  if (bVar2) {
    pNVar3 = (Node<QString,_QMakeLocalFileName> *)0x0;
  }
  else {
    pNVar3 = Bucket::node((Bucket *)0x1c9a16);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pNVar3;
  }
  __stack_chk_fail();
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }